

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::test_ParseFixedPoint::test_method(test_ParseFixedPoint *this)

{
  readonly_property65 rVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  string_view val;
  string_view val_00;
  string_view val_01;
  string_view val_02;
  string_view val_03;
  string_view val_04;
  string_view val_05;
  string_view val_06;
  string_view val_07;
  string_view val_08;
  string_view val_09;
  string_view val_10;
  string_view val_11;
  string_view val_12;
  string_view val_13;
  string_view val_14;
  string_view val_15;
  string_view val_16;
  string_view val_17;
  string_view val_18;
  string_view val_19;
  string_view val_20;
  string_view val_21;
  string_view val_22;
  string_view val_23;
  string_view val_24;
  string_view val_25;
  string_view val_26;
  string_view val_27;
  string_view val_28;
  string_view val_29;
  string_view val_30;
  string_view val_31;
  string_view val_32;
  string_view val_33;
  string_view val_34;
  string_view val_35;
  string_view val_36;
  string_view val_37;
  string_view val_38;
  string_view val_39;
  string_view val_40;
  string_view val_41;
  string_view val_42;
  string_view val_43;
  string_view val_44;
  string_view val_45;
  string_view val_46;
  check_type cVar5;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  undefined1 *local_ae0;
  undefined1 *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  char *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a58;
  undefined1 *local_a50;
  undefined1 *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  undefined1 *local_a20;
  undefined1 *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  undefined1 *local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char *local_9c8;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 local_128 [16];
  undefined1 *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  int64_t amount;
  undefined1 **local_b0;
  undefined **local_a8;
  element_type *local_a0;
  shared_count sStack_98;
  undefined1 ***local_90;
  int64_t *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  lazy_ostream *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  amount = 0;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x41c;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  _cVar5 = 0x726b51;
  val._M_str = "0";
  val._M_len = 1;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_68 = (lazy_ostream *)local_128;
  local_128._0_8_ = "ParseFixedPoint(\"0\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_e8,0x41c);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x41d;
  file_00.m_begin = (iterator)&local_f8;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 0);
  local_b0 = &local_130;
  local_130 = (undefined1 *)0x0;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_68 = (lazy_ostream *)&local_88;
  local_88 = &amount;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x41d,
             &local_80,"0LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x41e;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  _cVar5 = 0x726d98;
  val_00._M_str = "1";
  val_00._M_len = 1;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_00,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_158 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_160,0x41e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x41f;
  file_02.m_begin = (iterator)&local_170;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
             msg_02);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 100000000);
  local_130 = (undefined1 *)0x5f5e100;
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x41f,
             &local_80,"100000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x420;
  file_03.m_begin = (iterator)&local_190;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a0,
             msg_03);
  _cVar5 = 0x726fef;
  val_01._M_str = "0.0";
  val_01._M_len = 3;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_01,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"0.0\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_1b0,0x420);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x421;
  file_04.m_begin = (iterator)&local_1c0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d0,
             msg_04);
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 0);
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_130 = (undefined1 *)0x0;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x421,
             &local_80,"0LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x422;
  file_05.m_begin = (iterator)&local_1e0;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1f0,
             msg_05);
  _cVar5 = 0x72723f;
  val_02._M_str = "-0.1";
  val_02._M_len = 4;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_02,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"-0.1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_200,0x422);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x423;
  file_06.m_begin = (iterator)&local_210;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_220,
             msg_06);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == -10000000);
  local_130 = (undefined1 *)0xffffffffff676980;
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x423,
             &local_80,"-10000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x424;
  file_07.m_begin = (iterator)&local_230;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_240,
             msg_07);
  _cVar5 = 0x727483;
  val_03._M_str = "1.1";
  val_03._M_len = 3;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_03,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"1.1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_248 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_250,0x424);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x425;
  file_08.m_begin = (iterator)&local_260;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_270,
             msg_08);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 110000000);
  local_130 = (undefined1 *)0x68e7780;
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x425,
             &local_80,"110000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x426;
  file_09.m_begin = (iterator)&local_280;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_290,
             msg_09);
  _cVar5 = 0x7276d3;
  val_04._M_str = "1.10000000000000000";
  val_04._M_len = 0x13;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_04,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"1.10000000000000000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_298 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_2a0,0x426);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x427;
  file_10.m_begin = (iterator)&local_2b0;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2c0,
             msg_10);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 110000000);
  local_130 = (undefined1 *)0x68e7780;
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x427,
             &local_80,"110000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x428;
  file_11.m_begin = (iterator)&local_2d0;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2e0,
             msg_11);
  _cVar5 = 0x727929;
  val_05._M_str = "1.1e1";
  val_05._M_len = 5;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_05,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"1.1e1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_2f0,0x428);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x429;
  file_12.m_begin = (iterator)&local_300;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_310,
             msg_12);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 1100000000);
  local_130 = (undefined1 *)0x4190ab00;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_88 = &amount;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x429,
             &local_80,"1100000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x42a;
  file_13.m_begin = (iterator)&local_320;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_330,
             msg_13);
  _cVar5 = 0x727b70;
  val_06._M_str = "1.1e-1";
  val_06._M_len = 6;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_06,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"1.1e-1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_338 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_340,0x42a);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x42b;
  file_14.m_begin = (iterator)&local_350;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_360,
             msg_14);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1 *)amount == &LAB_00a7d8b9_7);
  local_130 = &LAB_00a7d8b9_7;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_88 = &amount;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x42b,
             &local_80,"11000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x42c;
  file_15.m_begin = (iterator)&local_370;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_380,
             msg_15);
  _cVar5 = 0x727db7;
  val_07._M_str = "1000";
  val_07._M_len = 4;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_07,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"1000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_388 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_390,0x42c);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x42d;
  file_16.m_begin = (iterator)&local_3a0;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3b0,
             msg_16);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 100000000000);
  local_130 = (undefined1 *)0x174876e800;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_88 = &amount;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x42d,
             &local_80,"100000000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x42e;
  file_17.m_begin = (iterator)&local_3c0;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_3d0,
             msg_17);
  _cVar5 = 0x728003;
  val_08._M_str = "-1000";
  val_08._M_len = 5;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_08,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"-1000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_3e0,0x42e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x42f;
  file_18.m_begin = (iterator)&local_3f0;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_400,
             msg_18);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == -100000000000);
  local_130 = (undefined1 *)0xffffffe8b7891800;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_88 = &amount;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x42f,
             &local_80,"-100000000000LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x430;
  file_19.m_begin = (iterator)&local_410;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_420,
             msg_19);
  _cVar5 = 0x72824f;
  val_09._M_str = "0.00000001";
  val_09._M_len = 10;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_09,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"0.00000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_428 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_430,0x430);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x431;
  file_20.m_begin = (iterator)&local_440;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_450,
             msg_20);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 1);
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_130 = (undefined1 *)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_88 = &amount;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x431,
             &local_80,"1LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x432;
  file_21.m_begin = (iterator)&local_460;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_470,
             msg_21);
  _cVar5 = 0x72849e;
  val_10._M_str = "0.0000000100000000";
  val_10._M_len = 0x12;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_10,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"0.0000000100000000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_478 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_480,0x432);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x433;
  file_22.m_begin = (iterator)&local_490;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4a0,
             msg_22);
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 1);
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_130 = (undefined1 *)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x433,
             &local_80,"1LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x434;
  file_23.m_begin = (iterator)&local_4b0;
  msg_23.m_end = pvVar4;
  msg_23.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_4c0,
             msg_23);
  _cVar5 = 0x7286ee;
  val_11._M_str = "-0.00000001";
  val_11._M_len = 0xb;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_11,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"-0.00000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_4d0,0x434);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x435;
  file_24.m_begin = (iterator)&local_4e0;
  msg_24.m_end = pvVar4;
  msg_24.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_4f0,
             msg_24);
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == -1);
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_130 = (undefined1 *)0xffffffffffffffff;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x435,
             &local_80,"-1LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x436;
  file_25.m_begin = (iterator)&local_500;
  msg_25.m_end = pvVar4;
  msg_25.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_510,
             msg_25);
  _cVar5 = 0x728930;
  val_12._M_str = "1000000000.00000001";
  val_12._M_len = 0x13;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_12,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"1000000000.00000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_518 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_520,0x436);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x437;
  file_26.m_begin = (iterator)&local_530;
  msg_26.m_end = pvVar4;
  msg_26.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_540,
             msg_26);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 0x16345785d8a0001);
  local_130 = (undefined1 *)0x16345785d8a0001;
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x437,
             &local_80,"100000000000000001LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x438;
  file_27.m_begin = (iterator)&local_550;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_560,
             msg_27);
  _cVar5 = 0x728b77;
  val_13._M_str = "9999999999.99999999";
  val_13._M_len = 0x13;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_13,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"9999999999.99999999\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_570 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_568 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_570,0x438);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x439;
  file_28.m_begin = (iterator)&local_580;
  msg_28.m_end = pvVar4;
  msg_28.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_590,
             msg_28);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 999999999999999999);
  local_130 = (undefined1 *)0xde0b6b3a763ffff;
  local_88 = &amount;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_80.m_empty = false;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_110 = "";
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x439,
             &local_80,"999999999999999999LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x43a;
  file_29.m_begin = (iterator)&local_5a0;
  msg_29.m_end = pvVar4;
  msg_29.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_5b0,
             msg_29);
  _cVar5 = 0x728dc4;
  val_14._M_str = "-9999999999.99999999";
  val_14._M_len = 0x14;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_14,8,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"-9999999999.99999999\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_5c0,0x43a);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x43b;
  file_30.m_begin = (iterator)&local_5d0;
  msg_30.m_end = pvVar4;
  msg_30.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_5e0,
             msg_30);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == -999999999999999999);
  local_110 = "";
  local_130 = (undefined1 *)0xf21f494c589c0001;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013ae958;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_88 = &amount;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x43b,
             &local_80,"-999999999999999999LL",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x43d;
  file_31.m_begin = (iterator)&local_5f0;
  msg_31.m_end = pvVar4;
  msg_31.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_600,
             msg_31);
  _cVar5 = 0x729010;
  bVar2 = ParseFixedPoint((string_view)(ZEXT816(0xf73bdc) << 0x40),8,&amount);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_608 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  local_a8._0_1_ = (class_property<bool>)(class_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_610,0x43d);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x43e;
  file_32.m_begin = (iterator)&local_620;
  msg_32.m_end = pvVar4;
  msg_32.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_630,
             msg_32);
  _cVar5 = 0x7290f8;
  val_15._M_str = "-";
  val_15._M_len = 1;
  bVar2 = ParseFixedPoint(val_15,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_638 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_640,0x43e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x43f;
  file_33.m_begin = (iterator)&local_650;
  msg_33.m_end = pvVar4;
  msg_33.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_660,
             msg_33);
  _cVar5 = 0x7291dc;
  val_16._M_str = "a-1000";
  val_16._M_len = 6;
  bVar2 = ParseFixedPoint(val_16,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"a-1000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_668 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_670,0x43f);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x440;
  file_34.m_begin = (iterator)&local_680;
  msg_34.m_end = pvVar4;
  msg_34.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_690,
             msg_34);
  _cVar5 = 0x7292c0;
  val_17._M_str = "-a1000";
  val_17._M_len = 6;
  bVar2 = ParseFixedPoint(val_17,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-a1000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_698 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_6a0,0x440);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x441;
  file_35.m_begin = (iterator)&local_6b0;
  msg_35.m_end = pvVar4;
  msg_35.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_6c0,
             msg_35);
  _cVar5 = 0x7293a4;
  val_18._M_str = "-1000a";
  val_18._M_len = 6;
  bVar2 = ParseFixedPoint(val_18,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-1000a\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_6d0,0x441);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x442;
  file_36.m_begin = (iterator)&local_6e0;
  msg_36.m_end = pvVar4;
  msg_36.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_6f0,
             msg_36);
  _cVar5 = 0x729488;
  val_19._M_str = "-01000";
  val_19._M_len = 6;
  bVar2 = ParseFixedPoint(val_19,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-01000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_6f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_700,0x442);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x443;
  file_37.m_begin = (iterator)&local_710;
  msg_37.m_end = pvVar4;
  msg_37.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_720,
             msg_37);
  _cVar5 = 0x72956c;
  val_20._M_str = "00.1";
  val_20._M_len = 4;
  bVar2 = ParseFixedPoint(val_20,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"00.1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_728 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_730,0x443);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x444;
  file_38.m_begin = (iterator)&local_740;
  msg_38.m_end = pvVar4;
  msg_38.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_750,
             msg_38);
  _cVar5 = 0x729650;
  val_21._M_str = ".1";
  val_21._M_len = 2;
  bVar2 = ParseFixedPoint(val_21,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\".1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_758 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_760,0x444);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x445;
  file_39.m_begin = (iterator)&local_770;
  msg_39.m_end = pvVar4;
  msg_39.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_780,
             msg_39);
  _cVar5 = 0x729734;
  val_22._M_str = "--0.1";
  val_22._M_len = 5;
  bVar2 = ParseFixedPoint(val_22,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"--0.1\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_788 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_790,0x445);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x446;
  file_40.m_begin = (iterator)&local_7a0;
  msg_40.m_end = pvVar4;
  msg_40.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_7b0,
             msg_40);
  _cVar5 = 0x729818;
  val_23._M_str = "0.000000001";
  val_23._M_len = 0xb;
  bVar2 = ParseFixedPoint(val_23,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"0.000000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_7c0,0x446);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x447;
  file_41.m_begin = (iterator)&local_7d0;
  msg_41.m_end = pvVar4;
  msg_41.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_7e0,
             msg_41);
  _cVar5 = 0x7298fc;
  val_24._M_str = "-0.000000001";
  val_24._M_len = 0xc;
  bVar2 = ParseFixedPoint(val_24,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-0.000000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_7f0,0x447);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x448;
  file_42.m_begin = (iterator)&local_800;
  msg_42.m_end = pvVar4;
  msg_42.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_810,
             msg_42);
  _cVar5 = 0x7299e0;
  val_25._M_str = "0.00000001000000001";
  val_25._M_len = 0x13;
  bVar2 = ParseFixedPoint(val_25,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"0.00000001000000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_818 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_820,0x448);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x449;
  file_43.m_begin = (iterator)&local_830;
  msg_43.m_end = pvVar4;
  msg_43.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_840,
             msg_43);
  _cVar5 = 0x729ac4;
  val_26._M_str = "-10000000000.00000000";
  val_26._M_len = 0x15;
  bVar2 = ParseFixedPoint(val_26,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-10000000000.00000000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_848 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_850,0x449);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_860 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x44a;
  file_44.m_begin = (iterator)&local_860;
  msg_44.m_end = pvVar4;
  msg_44.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_870,
             msg_44);
  _cVar5 = 0x729ba8;
  val_27._M_str = "10000000000.00000000";
  val_27._M_len = 0x14;
  bVar2 = ParseFixedPoint(val_27,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"10000000000.00000000\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_880 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_878 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_880,0x44a);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_890 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x44b;
  file_45.m_begin = (iterator)&local_890;
  msg_45.m_end = pvVar4;
  msg_45.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_8a0,
             msg_45);
  _cVar5 = 0x729c8c;
  val_28._M_str = "-10000000000.00000001";
  val_28._M_len = 0x15;
  bVar2 = ParseFixedPoint(val_28,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-10000000000.00000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_8b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_8a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_8b0,1099);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_8c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x44c;
  file_46.m_begin = (iterator)&local_8c0;
  msg_46.m_end = pvVar4;
  msg_46.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_8d0,
             msg_46);
  _cVar5 = 0x729d70;
  val_29._M_str = "10000000000.00000001";
  val_29._M_len = 0x14;
  bVar2 = ParseFixedPoint(val_29,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"10000000000.00000001\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_8e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_8d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_8e0,0x44c);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_8f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x44d;
  file_47.m_begin = (iterator)&local_8f0;
  msg_47.m_end = pvVar4;
  msg_47.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_900,
             msg_47);
  _cVar5 = 0x729e54;
  val_30._M_str = "-10000000000.00000009";
  val_30._M_len = 0x15;
  bVar2 = ParseFixedPoint(val_30,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-10000000000.00000009\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_910 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_908 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_910,0x44d);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_920 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x44e;
  file_48.m_begin = (iterator)&local_920;
  msg_48.m_end = pvVar4;
  msg_48.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_930,
             msg_48);
  _cVar5 = 0x729f38;
  val_31._M_str = "10000000000.00000009";
  val_31._M_len = 0x14;
  bVar2 = ParseFixedPoint(val_31,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"10000000000.00000009\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_940 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_938 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_940,0x44e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_950 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_948 = "";
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x44f;
  file_49.m_begin = (iterator)&local_950;
  msg_49.m_end = pvVar4;
  msg_49.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_960,
             msg_49);
  _cVar5 = 0x72a01c;
  val_32._M_str = "-99999999999.99999999";
  val_32._M_len = 0x15;
  bVar2 = ParseFixedPoint(val_32,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-99999999999.99999999\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_970 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_968 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_970,0x44f);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_980 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_978 = "";
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x450;
  file_50.m_begin = (iterator)&local_980;
  msg_50.m_end = pvVar4;
  msg_50.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_990,
             msg_50);
  _cVar5 = 0x72a100;
  val_33._M_str = "99999909999.09999999";
  val_33._M_len = 0x14;
  bVar2 = ParseFixedPoint(val_33,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"99999909999.09999999\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_9a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_998 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_9a0,0x450);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_9b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_9a8 = "";
  local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x451;
  file_51.m_begin = (iterator)&local_9b0;
  msg_51.m_end = pvVar4;
  msg_51.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_9c0,
             msg_51);
  _cVar5 = 0x72a1e4;
  val_34._M_str = "92233720368.54775807";
  val_34._M_len = 0x14;
  bVar2 = ParseFixedPoint(val_34,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"92233720368.54775807\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_9d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_9c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_9d0,0x451);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_9e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_9d8 = "";
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x452;
  file_52.m_begin = (iterator)&local_9e0;
  msg_52.m_end = pvVar4;
  msg_52.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_9f0,
             msg_52);
  _cVar5 = 0x72a2c8;
  val_35._M_str = "92233720368.54775808";
  val_35._M_len = 0x14;
  bVar2 = ParseFixedPoint(val_35,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"92233720368.54775808\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_9f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_a00,0x452);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_a10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a08 = "";
  local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x453;
  file_53.m_begin = (iterator)&local_a10;
  msg_53.m_end = pvVar4;
  msg_53.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_a20,
             msg_53);
  _cVar5 = 0x72a3ac;
  val_36._M_str = "-92233720368.54775808";
  val_36._M_len = 0x15;
  bVar2 = ParseFixedPoint(val_36,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-92233720368.54775808\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a28 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_a30,0x453);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_a40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a38 = "";
  local_a50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x454;
  file_54.m_begin = (iterator)&local_a40;
  msg_54.m_end = pvVar4;
  msg_54.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_a50,
             msg_54);
  _cVar5 = 0x72a490;
  val_37._M_str = "-92233720368.54775809";
  val_37._M_len = 0x15;
  bVar2 = ParseFixedPoint(val_37,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"-92233720368.54775809\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a58 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_a60,0x454);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_a70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a68 = "";
  local_a80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x455;
  file_55.m_begin = (iterator)&local_a70;
  msg_55.m_end = pvVar4;
  msg_55.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_a80,
             msg_55);
  _cVar5 = 0x72a574;
  val_38._M_str = "1.1e";
  val_38._M_len = 4;
  bVar2 = ParseFixedPoint(val_38,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"1.1e\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_a90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a88 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_a90,0x455);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_aa0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x456;
  file_56.m_begin = (iterator)&local_aa0;
  msg_56.m_end = pvVar4;
  msg_56.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_ab0,
             msg_56);
  _cVar5 = 0x72a658;
  val_39._M_str = "1.1e-";
  val_39._M_len = 5;
  bVar2 = ParseFixedPoint(val_39,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"1.1e-\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_ac0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_ab8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_ac0,0x456);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_ad0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_ac8 = "";
  local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0x457;
  file_57.m_begin = (iterator)&local_ad0;
  msg_57.m_end = pvVar4;
  msg_57.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_ae0,
             msg_57);
  _cVar5 = 0x72a73c;
  val_40._M_str = "1.";
  val_40._M_len = 2;
  bVar2 = ParseFixedPoint(val_40,8,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"1.\", 8, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_af0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_ae8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_af0,0x457);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_b00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_af8 = "";
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_58.m_end = (iterator)0x45a;
  file_58.m_begin = (iterator)&local_b00;
  msg_58.m_end = pvVar4;
  msg_58.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_b10,
             msg_58);
  _cVar5 = 0x72a823;
  val_41._M_str = "0.001";
  val_41._M_len = 5;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ParseFixedPoint(val_41,3,&amount);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ParseFixedPoint(\"0.001\", 3, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_b20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b18 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_b20,0x45a);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_b30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b28 = "";
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0x45b;
  file_59.m_begin = (iterator)&local_b30;
  msg_59.m_end = pvVar4;
  msg_59.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_b40,
             msg_59);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_013ae088;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(amount == 1);
  local_130 = (undefined1 *)0x1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_130;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013ae428;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_88 = &amount;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0x111e928,(size_t)&local_60,0x45b,
             &local_80,"CAmount{1}",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_b50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b48 = "";
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_60.m_end = (iterator)0x45c;
  file_60.m_begin = (iterator)&local_b50;
  msg_60.m_end = pvVar4;
  msg_60.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_b60,
             msg_60);
  _cVar5 = 0x72aa6a;
  val_42._M_str = "0.0009";
  val_42._M_len = 6;
  bVar2 = ParseFixedPoint(val_42,3,&amount);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"0.0009\", 3, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_b70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b68 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  local_a8._0_1_ = (class_property<bool>)(class_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_b70,0x45c);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_b80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b78 = "";
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0x45d;
  file_61.m_begin = (iterator)&local_b80;
  msg_61.m_end = pvVar4;
  msg_61.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_b90,
             msg_61);
  _cVar5 = 0x72ab52;
  val_43._M_str = "31.00100001";
  val_43._M_len = 0xb;
  bVar2 = ParseFixedPoint(val_43,3,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"31.00100001\", 3, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_ba0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_b98 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_ba0,0x45d);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_bb0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_ba8 = "";
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_62.m_end = (iterator)0x45e;
  file_62.m_begin = (iterator)&local_bb0;
  msg_62.m_end = pvVar4;
  msg_62.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_bc0,
             msg_62);
  _cVar5 = 0x72ac33;
  val_44._M_str = "31.0011";
  val_44._M_len = 7;
  bVar2 = ParseFixedPoint(val_44,3,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"31.0011\", 3, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_bd0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_bc8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_bd0,0x45e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_be0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_bd8 = "";
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0x45f;
  file_63.m_begin = (iterator)&local_be0;
  msg_63.m_end = pvVar4;
  msg_63.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_bf0,
             msg_63);
  _cVar5 = 0x72ad0e;
  val_45._M_str = "31.99999999";
  val_45._M_len = 0xb;
  bVar2 = ParseFixedPoint(val_45,3,&amount);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"31.99999999\", 3, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_c00 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_bf8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_c00,0x45f);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_c10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c08 = "";
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_64.m_end = (iterator)0x460;
  file_64.m_begin = (iterator)&local_c10;
  msg_64.m_end = pvVar4;
  msg_64.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_c20,
             msg_64);
  _cVar5 = 0x72ade9;
  val_46._M_str = "31.999999999999999999999";
  val_46._M_len = 0x18;
  bVar2 = ParseFixedPoint(val_46,3,&amount);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,!bVar2);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!ParseFixedPoint(\"31.999999999999999999999\", 3, &amount)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_c30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c28 = "";
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar5,(size_t)&local_c30,0x460);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ParseFixedPoint)
{
    int64_t amount = 0;
    BOOST_CHECK(ParseFixedPoint("0", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 0LL);
    BOOST_CHECK(ParseFixedPoint("1", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 100000000LL);
    BOOST_CHECK(ParseFixedPoint("0.0", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 0LL);
    BOOST_CHECK(ParseFixedPoint("-0.1", 8, &amount));
    BOOST_CHECK_EQUAL(amount, -10000000LL);
    BOOST_CHECK(ParseFixedPoint("1.1", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 110000000LL);
    BOOST_CHECK(ParseFixedPoint("1.10000000000000000", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 110000000LL);
    BOOST_CHECK(ParseFixedPoint("1.1e1", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 1100000000LL);
    BOOST_CHECK(ParseFixedPoint("1.1e-1", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 11000000LL);
    BOOST_CHECK(ParseFixedPoint("1000", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 100000000000LL);
    BOOST_CHECK(ParseFixedPoint("-1000", 8, &amount));
    BOOST_CHECK_EQUAL(amount, -100000000000LL);
    BOOST_CHECK(ParseFixedPoint("0.00000001", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 1LL);
    BOOST_CHECK(ParseFixedPoint("0.0000000100000000", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 1LL);
    BOOST_CHECK(ParseFixedPoint("-0.00000001", 8, &amount));
    BOOST_CHECK_EQUAL(amount, -1LL);
    BOOST_CHECK(ParseFixedPoint("1000000000.00000001", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 100000000000000001LL);
    BOOST_CHECK(ParseFixedPoint("9999999999.99999999", 8, &amount));
    BOOST_CHECK_EQUAL(amount, 999999999999999999LL);
    BOOST_CHECK(ParseFixedPoint("-9999999999.99999999", 8, &amount));
    BOOST_CHECK_EQUAL(amount, -999999999999999999LL);

    BOOST_CHECK(!ParseFixedPoint("", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("a-1000", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-a1000", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-1000a", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-01000", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("00.1", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint(".1", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("--0.1", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("0.000000001", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-0.000000001", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("0.00000001000000001", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-10000000000.00000000", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("10000000000.00000000", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-10000000000.00000001", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("10000000000.00000001", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-10000000000.00000009", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("10000000000.00000009", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-99999999999.99999999", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("99999909999.09999999", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("92233720368.54775807", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("92233720368.54775808", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-92233720368.54775808", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("-92233720368.54775809", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("1.1e", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("1.1e-", 8, &amount));
    BOOST_CHECK(!ParseFixedPoint("1.", 8, &amount));

    // Test with 3 decimal places for fee rates in sat/vB.
    BOOST_CHECK(ParseFixedPoint("0.001", 3, &amount));
    BOOST_CHECK_EQUAL(amount, CAmount{1});
    BOOST_CHECK(!ParseFixedPoint("0.0009", 3, &amount));
    BOOST_CHECK(!ParseFixedPoint("31.00100001", 3, &amount));
    BOOST_CHECK(!ParseFixedPoint("31.0011", 3, &amount));
    BOOST_CHECK(!ParseFixedPoint("31.99999999", 3, &amount));
    BOOST_CHECK(!ParseFixedPoint("31.999999999999999999999", 3, &amount));
}